

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Repeat_Button.cxx
# Opt level: O3

int __thiscall Fl_Repeat_Button::handle(Fl_Repeat_Button *this,int event)

{
  bool bVar1;
  int iVar2;
  int v;
  
  if ((uint)event < 0x10) {
    iVar2 = 0;
    if ((0xa004U >> (event & 0x1fU) & 1) == 0) {
      if ((0x22U >> (event & 0x1fU) & 1) == 0) goto LAB_001c67f6;
      bVar1 = Fl::option(OPTION_VISIBLE_FOCUS);
      if (bVar1) {
        Fl::focus((Fl_Widget *)this);
      }
      iVar2 = Fl::event_inside((Fl_Widget *)this);
    }
    v = 0;
    if (((this->super_Fl_Button).super_Fl_Widget.flags_ & 1) == 0) {
      v = iVar2;
    }
    iVar2 = Fl_Button::value(&this->super_Fl_Button,v);
    if (iVar2 != 0) {
      if (v == 0) {
        Fl::remove_timeout(repeat_callback,this);
      }
      else {
        Fl::add_timeout(0.5,repeat_callback,this);
        Fl_Widget::do_callback
                  ((Fl_Widget *)this,(Fl_Widget *)this,
                   (this->super_Fl_Button).super_Fl_Widget.user_data_);
      }
    }
    return 1;
  }
LAB_001c67f6:
  iVar2 = Fl_Button::handle(&this->super_Fl_Button,event);
  return iVar2;
}

Assistant:

int Fl_Repeat_Button::handle(int event) {
  int newval;
  switch (event) {
  case FL_HIDE:
  case FL_DEACTIVATE:
  case FL_RELEASE:
    newval = 0; goto J1;
  case FL_PUSH:
  case FL_DRAG:
    if (Fl::visible_focus()) Fl::focus(this);
    newval = Fl::event_inside(this);
  J1:
    if (!active()) 
      newval = 0;
    if (value(newval)) {
      if (newval) {
	Fl::add_timeout(INITIALREPEAT,repeat_callback,this);
	do_callback();
      } else {
	Fl::remove_timeout(repeat_callback,this);
      }
    }
    return 1;
  default:
    return Fl_Button::handle(event);
  }
}